

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_set(t_slider *x,t_floatarg f)

{
  int iVar1;
  double local_20;
  double g;
  int old;
  t_floatarg f_local;
  t_slider *x_local;
  
  iVar1 = x->x_val;
  x->x_fval = f;
  g._4_4_ = f;
  if (x->x_min < x->x_max || x->x_min == x->x_max) {
    if (x->x_max <= (double)f && (double)f != x->x_max) {
      g._4_4_ = (t_floatarg)x->x_max;
    }
    if ((double)g._4_4_ < x->x_min) {
      g._4_4_ = (t_floatarg)x->x_min;
    }
  }
  else {
    if (x->x_min <= (double)f && (double)f != x->x_min) {
      g._4_4_ = (t_floatarg)x->x_min;
    }
    if ((double)g._4_4_ < x->x_max) {
      g._4_4_ = (t_floatarg)x->x_max;
    }
  }
  if (x->x_lin0_log1 == 0) {
    local_20 = ((double)g._4_4_ - x->x_min) / x->x_k;
  }
  else {
    local_20 = log((double)g._4_4_ / x->x_min);
    local_20 = local_20 / x->x_k;
  }
  x->x_val = (int)(local_20 * 100.0 + 0.49999);
  if (x->x_val != iVar1) {
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  }
  return;
}

Assistant:

static void slider_set(t_slider *x, t_floatarg f)
{
    int old = x->x_val;
    double g;

    x->x_fval = f;
    if (x->x_min > x->x_max)
    {
        if(f > x->x_min)
            f = x->x_min;
        if(f < x->x_max)
            f = x->x_max;
    }
    else
    {
        if(f > x->x_max)
            f = x->x_max;
        if(f < x->x_min)
            f = x->x_min;
    }
    if(x->x_lin0_log1)
        g = log(f/x->x_min) / x->x_k;
    else
        g = (f - x->x_min) / x->x_k;
    x->x_val = (int)(100.0*g + 0.49999);
    if(x->x_val != old)
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
}